

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Glucose::Heap<Glucose::Solver::VarOrderLt>::build
          (Heap<Glucose::Solver::VarOrderLt> *this,vec<int> *ns)

{
  int iVar1;
  int *piVar2;
  vec<int> *this_00;
  vec<int> *in_RSI;
  long in_RDI;
  Heap<Glucose::Solver::VarOrderLt> *unaff_retaddr;
  int i_2;
  int i_1;
  int i;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  long lVar3;
  
  local_14 = 0;
  lVar3 = in_RDI;
  while( true ) {
    iVar1 = vec<int>::size((vec<int> *)(in_RDI + 8));
    if (iVar1 <= local_14) break;
    piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_14);
    piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x18),*piVar2);
    *piVar2 = -1;
    local_14 = local_14 + 1;
  }
  vec<int>::clear((vec<int> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
  local_18 = 0;
  while( true ) {
    iVar1 = vec<int>::size(in_RSI);
    if (iVar1 <= local_18) break;
    this_00 = (vec<int> *)(in_RDI + 0x18);
    iVar1 = local_18;
    piVar2 = vec<int>::operator[](in_RSI,local_18);
    piVar2 = vec<int>::operator[](this_00,*piVar2);
    *piVar2 = iVar1;
    vec<int>::operator[](in_RSI,local_18);
    vec<int>::push((vec<int> *)CONCAT44(iVar1,in_stack_ffffffffffffffb0),(int *)this_00);
    local_18 = local_18 + 1;
  }
  local_1c = vec<int>::size((vec<int> *)(in_RDI + 8));
  local_1c = local_1c / 2;
  while (local_1c = local_1c + -1, -1 < local_1c) {
    percolateDown(unaff_retaddr,(int)((ulong)lVar3 >> 0x20));
  }
  return;
}

Assistant:

void build(vec<int>& ns) {
        for (int i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear();

        for (int i = 0; i < ns.size(); i++){
            indices[ns[i]] = i;
            heap.push(ns[i]); }

        for (int i = heap.size() / 2 - 1; i >= 0; i--)
            percolateDown(i);
    }